

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileExecutableTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileExecutableTargetGenerator::~cmMakefileExecutableTargetGenerator
          (cmMakefileExecutableTargetGenerator *this)

{
  cmMakefileExecutableTargetGenerator *this_local;
  
  ~cmMakefileExecutableTargetGenerator(this);
  operator_delete(this,0x400);
  return;
}

Assistant:

cmMakefileExecutableTargetGenerator::~cmMakefileExecutableTargetGenerator()
{
  delete this->OSXBundleGenerator;
}